

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O3

int SUNLinSolInitialize_SPBCGS(SUNLinearSolver S)

{
  int *piVar1;
  
  if (S != (SUNLinearSolver)0x0) {
    piVar1 = (int *)S->content;
    if (2 < piVar1[1] - 1U) {
      piVar1[1] = 0;
    }
    if (*piVar1 < 1) {
      *piVar1 = 5;
    }
    piVar1[6] = 0;
    piVar1[7] = 0;
    return 0;
  }
  return -1;
}

Assistant:

int SUNLinSolInitialize_SPBCGS(SUNLinearSolver S)
{
  /* ensure valid options */
  if (S == NULL) return(SUNLS_MEM_NULL);  
  if ( (PRETYPE(S) != PREC_LEFT) && 
       (PRETYPE(S) != PREC_RIGHT) && 
       (PRETYPE(S) != PREC_BOTH) )
    PRETYPE(S) = PREC_NONE;
  if (SPBCGS_CONTENT(S)->maxl <= 0) 
    SPBCGS_CONTENT(S)->maxl = SUNSPBCGS_MAXL_DEFAULT;

  /* no additional memory to allocate */
  
  /* return with success */
  LASTFLAG(S) = SUNLS_SUCCESS;
  return(LASTFLAG(S));
}